

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

TestSuite * __thiscall testing::UnitTest::GetMutableTestSuite(UnitTest *this,int i)

{
  TestSuite *pTVar1;
  
  pTVar1 = internal::UnitTestImpl::GetMutableSuiteCase(this->impl_,i);
  return pTVar1;
}

Assistant:

internal::UnitTestImpl* impl() { return impl_; }